

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::append_global_func_args
          (CompilerGLSL *this,SPIRFunction *func,uint32_t index,
          SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
          *arglist)

{
  Parameter *pPVar1;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *this_00;
  uint32_t uVar2;
  size_t sVar3;
  SPIRVariable *pSVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68 [36];
  uint32_t local_44;
  Parameter *pPStack_40;
  uint32_t var_id;
  Parameter *arg;
  uint32_t arg_idx;
  uint32_t arg_cnt;
  SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *args;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *arglist_local;
  SPIRFunction *pSStack_18;
  uint32_t index_local;
  SPIRFunction *func_local;
  CompilerGLSL *this_local;
  
  _arg_idx = &(func->arguments).super_VectorView<spirv_cross::SPIRFunction::Parameter>;
  args = (SmallVector<spirv_cross::SPIRFunction::Parameter,_8UL> *)arglist;
  arglist_local._4_4_ = index;
  pSStack_18 = func;
  func_local = (SPIRFunction *)this;
  sVar3 = VectorView<spirv_cross::SPIRFunction::Parameter>::size(_arg_idx);
  arg._4_4_ = (uint)sVar3;
  arg._0_4_ = arglist_local._4_4_;
  while( true ) {
    if (arg._4_4_ <= (uint)arg) {
      return;
    }
    pPStack_40 = VectorView<spirv_cross::SPIRFunction::Parameter>::operator[]
                           (_arg_idx,(ulong)(uint)arg);
    if ((pPStack_40->alias_global_variable & 1U) == 0) break;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_40->id);
    pSVar4 = Compiler::get<spirv_cross::SPIRVariable>(&this->super_Compiler,uVar2);
    local_44 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSVar4->basevariable);
    if (local_44 != 0) {
      flush_variable_declaration(this,local_44);
    }
    this_00 = args;
    pPVar1 = pPStack_40;
    uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pPStack_40->id);
    (*(this->super_Compiler)._vptr_Compiler[0x1d])(local_68,this,pPVar1,(ulong)uVar2);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                 *)this_00,local_68);
    ::std::__cxx11::string::~string((string *)local_68);
    arg._0_4_ = (uint)arg + 1;
  }
  __assert_fail("arg.alias_global_variable",
                "/workspace/llm4binary/github/license_c_cmakelists/EpicGames[P]SPIRV-Cross/spirv_glsl.cpp"
                ,0x39c7,
                "void spirv_cross::CompilerGLSL::append_global_func_args(const SPIRFunction &, uint32_t, SmallVector<string> &)"
               );
}

Assistant:

void CompilerGLSL::append_global_func_args(const SPIRFunction &func, uint32_t index, SmallVector<string> &arglist)
{
	auto &args = func.arguments;
	uint32_t arg_cnt = uint32_t(args.size());
	for (uint32_t arg_idx = index; arg_idx < arg_cnt; arg_idx++)
	{
		auto &arg = args[arg_idx];
		assert(arg.alias_global_variable);

		// If the underlying variable needs to be declared
		// (ie. a local variable with deferred declaration), do so now.
		uint32_t var_id = get<SPIRVariable>(arg.id).basevariable;
		if (var_id)
			flush_variable_declaration(var_id);

		arglist.push_back(to_func_call_arg(arg, arg.id));
	}
}